

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_util.h
# Opt level: O0

char * create_library_path_abi_cxx11_(char *name,char *path)

{
  int iVar1;
  char *in_RDX;
  char *path_local;
  char *name_local;
  string *library_path;
  
  std::__cxx11::string::string((string *)name);
  if ((in_RDX == (char *)0x0) || (iVar1 = strcmp("",in_RDX), iVar1 == 0)) {
    std::__cxx11::string::assign(name);
  }
  else {
    std::__cxx11::string::assign(name);
    std::__cxx11::string::append(name);
    std::__cxx11::string::append(name);
  }
  return name;
}

Assistant:

inline std::string create_library_path(const char *name, const char *path){
    std::string library_path;
    if (path && (strcmp("", path) != 0)) {
        library_path.assign(path);
#ifdef _WIN32
        library_path.append("\\");
#else
        library_path.append("/");
#endif
        library_path.append(name);
    } else {
        library_path.assign(name);
    }
    return library_path;
}